

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O1

int video_to_image(char *video_name,char *dir_name)

{
  Size *pSVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  uint __len;
  uint uVar10;
  string img_path;
  string __str;
  VideoCapture cap;
  Mat img;
  uint local_15c;
  long *local_158;
  Mat *local_150;
  long lStack_148;
  long lStack_140;
  _InputArray local_138;
  long lStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  uint local_cc;
  char *local_c8;
  _OutputArray local_c0 [2];
  Mat local_90 [96];
  
  local_c8 = dir_name;
  cv::Mat::Mat(local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,video_name,(allocator<char> *)&local_138);
  cv::VideoCapture::VideoCapture((VideoCapture *)local_c0,(string *)&local_158,0);
  if (local_158 != &lStack_148) {
    operator_delete(local_158,lStack_148 + 1);
  }
  cVar3 = cv::VideoCapture::isOpened();
  if (cVar3 == '\0') {
    perror("Open video file failed!\n");
  }
  uVar10 = 1;
  iVar9 = 0;
  local_15c = 0;
  do {
    lStack_148 = 0;
    local_158 = (long *)CONCAT44(local_158._4_4_,0x2010000);
    local_150 = local_90;
    cv::VideoCapture::read(local_c0);
    cVar3 = cv::Mat::empty();
    uVar10 = uVar10 & 0xff;
    if (cVar3 != '\0') {
      uVar10 = 0;
    }
    if (((uint)(iVar9 * -0x33333333) >> 2 | iVar9 * 0x40000000) < 0xccccccd) {
      local_cc = uVar10;
      std::operator+(&local_118,local_c8,&forward_slash_abi_cxx11_);
      local_15c = local_15c + 1;
      uVar10 = -local_15c;
      if (0 < (int)local_15c) {
        uVar10 = local_15c;
      }
      __len = 1;
      if (9 < uVar10) {
        uVar6 = (ulong)uVar10;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar6;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_0010526c;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_0010526c;
          }
          if (uVar4 < 10000) goto LAB_0010526c;
          uVar6 = uVar6 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_0010526c:
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_f0,(char)__len - (char)((int)local_15c >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(local_15c >> 0x1f) + (long)local_f0),__len,uVar10);
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar8 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_e8 + local_118._M_string_length) {
        uVar6 = 0xf;
        if (local_f0 != local_e0) {
          uVar6 = local_e0[0];
        }
        if (uVar6 < local_e8 + local_118._M_string_length) goto LAB_0010530a;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_f0,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p
                                   );
      }
      else {
LAB_0010530a:
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f0);
      }
      pSVar1 = (Size *)(plVar5 + 2);
      if ((Size *)*plVar5 == pSVar1) {
        local_138.sz = *pSVar1;
        lStack_120 = plVar5[3];
        local_138._0_8_ = &local_138.sz;
      }
      else {
        local_138.sz = *pSVar1;
        local_138._0_8_ = (Size *)*plVar5;
      }
      local_138.obj = (void *)plVar5[1];
      *plVar5 = (long)pSVar1;
      plVar5[1] = 0;
      *(undefined1 *)&pSVar1->width = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_138,(ulong)suffix_png_abi_cxx11_._M_dataplus._M_p);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        lStack_148 = *plVar7;
        lStack_140 = plVar5[3];
        local_158 = &lStack_148;
      }
      else {
        lStack_148 = *plVar7;
        local_158 = (long *)*plVar5;
      }
      local_150 = (Mat *)plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((Size *)local_138._0_8_ != &local_138.sz) {
        operator_delete((void *)local_138._0_8_,(ulong)((long)local_138.sz + 1));
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x1010000;
      local_118.field_2._M_allocated_capacity = 0;
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      local_138.obj = local_90;
      cv::imwrite((string *)&local_158,&local_138,(vector *)&local_118);
      uVar10 = local_cc;
      if (local_118._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_118._M_dataplus._M_p,
                        local_118.field_2._M_allocated_capacity - (long)local_118._M_dataplus._M_p);
      }
      if (local_158 != &lStack_148) {
        operator_delete(local_158,lStack_148 + 1);
      }
    }
    iVar9 = iVar9 + 1;
    if ((uVar10 & 1) == 0) {
      cv::VideoCapture::release();
      cv::VideoCapture::~VideoCapture((VideoCapture *)local_c0);
      cv::Mat::~Mat(local_90);
      return 0;
    }
  } while( true );
}

Assistant:

int video_to_image(const char *video_name, const char *dir_name) {
  int frame_cnt = 0;
  int num = 0;
  Mat img;

  VideoCapture cap(video_name);
  if (!cap.isOpened()) perror("Open video file failed!\n");

  bool flag = true;
  while (flag) {
    bool success = cap.read(img);
    if (img.empty()) flag = false;

    if (frame_cnt % 20 == 0) {
      ++num;
      string img_path = dir_name + forward_slash + to_string(num) + suffix_png;
      imwrite(img_path, img);
    }
    ++frame_cnt;
  }
  cap.release();
  return 0;
}